

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Map.h
# Opt level: O2

Path * __thiscall
Map<int,_Path,_std::less<int>_>::value
          (Path *__return_storage_ptr__,Map<int,_Path,_std::less<int>_> *this,int *key,
          Path *defaultValue,bool *ok)

{
  const_iterator cVar1;
  
  cVar1 = std::
          _Rb_tree<int,_std::pair<const_int,_Path>,_std::_Select1st<std::pair<const_int,_Path>_>,_std::less<int>,_std::allocator<std::pair<const_int,_Path>_>_>
          ::find((_Rb_tree<int,_std::pair<const_int,_Path>,_std::_Select1st<std::pair<const_int,_Path>_>,_std::less<int>,_std::allocator<std::pair<const_int,_Path>_>_>
                  *)this,key);
  if ((_Rb_tree_header *)cVar1._M_node ==
      &(this->super_map<int,_Path,_std::less<int>,_std::allocator<std::pair<const_int,_Path>_>_>).
       _M_t._M_impl.super__Rb_tree_header) {
    if (ok != (bool *)0x0) {
      *ok = false;
    }
  }
  else {
    if (ok != (bool *)0x0) {
      *ok = true;
    }
    defaultValue = (Path *)&cVar1._M_node[1]._M_parent;
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)defaultValue);
  return __return_storage_ptr__;
}

Assistant:

Value value(const Key &key, const Value &defaultValue, bool *ok = 0) const
    {
        typename Base::const_iterator it = Base::find(key);
        if (it == Base::end()) {
            if (ok)
                *ok = false;
            return defaultValue;
        }
        if (ok)
            *ok = true;
        return it->second;
    }